

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknetactivation.cpp
# Opt level: O2

float __thiscall ncnn::activate_op_stair<float>::operator()(activate_op_stair<float> *this,float *x)

{
  float __x;
  float fVar1;
  double dVar2;
  
  __x = *x;
  fVar1 = floorf(__x);
  if (((int)fVar1 & 1U) == 0) {
    dVar2 = floor((double)__x * 0.5);
  }
  else {
    dVar2 = floor((double)__x * 0.5);
    dVar2 = dVar2 + (double)(__x - (float)(int)fVar1);
  }
  return (float)dVar2;
}

Assistant:

T operator()(const T &x) const
  {
    int n = floor(x);
    if (n % 2 == 0)
      return floor(x / 2.);
    else
      return (x - n) + floor(x / 2.);
  }